

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_RetFindSources(Wln_Ret_t *p)

{
  int iVar1;
  uint uVar2;
  Wln_Ntk_t *pWVar3;
  int *piVar4;
  long lVar5;
  
  (p->vSources).nSize = 0;
  pWVar3 = p->pNtk;
  iVar1 = pWVar3->nTravIds;
  pWVar3->nTravIds = iVar1 + 1;
  if (iVar1 == 0) {
    uVar2 = (pWVar3->vTypes).nCap;
    if ((pWVar3->vTravIds).nCap < (int)uVar2) {
      piVar4 = (pWVar3->vTravIds).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar2 << 2);
      }
      (pWVar3->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pWVar3->vTravIds).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((pWVar3->vTravIds).pArray,0,(ulong)uVar2 * 4);
    }
    (pWVar3->vTravIds).nSize = uVar2;
  }
  if (0 < (p->vSinks).nSize) {
    lVar5 = 0;
    do {
      Wln_RetFindSources_rec(p,(p->vSinks).pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vSinks).nSize);
  }
  return;
}

Assistant:

void Wln_RetFindSources( Wln_Ret_t * p )
{
    int i, iObj;
    Vec_IntClear( &p->vSources );
    Wln_NtkIncrementTravId( p->pNtk );
    Vec_IntForEachEntry( &p->vSinks, iObj, i )
        Wln_RetFindSources_rec( p, iObj );

//    printf( "Sources: " );
//    Vec_IntPrint( &p->vSources );
}